

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csnode_dfs.c
# Opt level: O1

int_t csnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int_t *xprune,
                int *marker,GlobalLU_t *Glu)

{
  int_t *piVar1;
  int_t iVar2;
  int_t *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined4 in_register_00000034;
  undefined8 uVar8;
  long lVar9;
  int next;
  int_t nzlmax;
  int local_84;
  int local_80;
  int local_7c;
  long local_78;
  int_t *local_70;
  long local_68;
  int local_5c;
  long local_58;
  int *local_50;
  int_t *local_48;
  int *local_40;
  int_t *local_38;
  
  uVar8 = CONCAT44(in_register_00000034,kcol);
  local_50 = Glu->xsup;
  local_40 = Glu->supno;
  piVar3 = Glu->lsub;
  local_48 = Glu->xlsub;
  local_84 = Glu->nzlmax;
  local_58 = (long)jcol;
  local_78 = (long)local_40[local_58];
  local_80 = local_40[local_58] + 1;
  local_40[local_58] = local_80;
  next = local_48[local_58];
  local_7c = jcol;
  local_70 = xprune;
  local_38 = xa_begin;
  if (jcol <= kcol) {
    lVar9 = (long)jcol;
    local_5c = kcol + 1;
    do {
      lVar5 = (long)local_38[lVar9];
      local_68 = lVar9;
      if (local_38[lVar9] < xa_end[lVar9]) {
        do {
          iVar4 = asub[lVar5];
          if (marker[iVar4] != kcol) {
            marker[iVar4] = kcol;
            lVar6 = (long)next;
            next = next + 1;
            piVar3[lVar6] = iVar4;
            if (local_84 <= next) {
              iVar2 = cLUMemXpand(jcol,next,LSUB,&local_84,Glu);
              if (iVar2 != 0) {
                return iVar2;
              }
              piVar3 = Glu->lsub;
              lVar9 = local_68;
              jcol = local_7c;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < xa_end[lVar9]);
      }
      local_40[lVar9] = local_80;
      lVar9 = lVar9 + 1;
    } while (local_5c != (int)lVar9);
  }
  piVar1 = local_48;
  lVar9 = (long)kcol;
  local_68 = uVar8;
  iVar4 = next;
  if (jcol < kcol) {
    iVar7 = next * 2 - local_48[local_58];
    if (local_84 < iVar7) {
      do {
        iVar2 = cLUMemXpand(jcol,next,LSUB,&local_84,Glu);
        if (iVar2 != 0) {
          return iVar2;
        }
        jcol = local_7c;
      } while (local_84 < iVar7);
      piVar3 = Glu->lsub;
    }
    iVar7 = piVar1[local_58];
    if (iVar7 < next) {
      lVar5 = 0;
      do {
        piVar3[next + lVar5] = piVar3[iVar7 + lVar5];
        lVar5 = lVar5 + 1;
      } while ((long)next - (long)iVar7 != lVar5);
      iVar4 = (int)lVar5 + next;
    }
    if (jcol < (int)local_68) {
      do {
        piVar1[local_58 + 1] = next;
        local_58 = local_58 + 1;
      } while (lVar9 != local_58);
    }
  }
  local_50[local_78 + 2] = (int)local_68 + 1;
  local_40[lVar9 + 1] = local_80;
  local_70[lVar9] = iVar4;
  piVar1[lVar9 + 1] = iVar4;
  return 0;
}

Assistant:

int_t
csnode_dfs (
	   const int   jcol,	    /* in - start of the supernode */
	   const int   kcol, 	    /* in - end of the supernode */
	   const int_t *asub,        /* in */
	   const int_t *xa_begin,    /* in */
	   const int_t *xa_end,      /* in */
	   int_t      *xprune,      /* out */
	   int        *marker,      /* modified */
	   GlobalLU_t *Glu          /* modified */
	   )
{

    int_t i, k, ifrom, ito, nextl, new_next, nzlmax;
    int   nsuper, krow, kmark;
    int_t mem_error;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++) {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++) {	
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol ) { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax ) {
		    mem_error = cLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
		    if ( mem_error ) return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
    	}
	supno[i] = nsuper;
    }

    /* Supernode > 1, then make a copy of the subscripts for pruning */
    if ( jcol < kcol ) {
	new_next = nextl + (nextl - xlsub[jcol]);
	while ( new_next > nzlmax ) {
	    mem_error = cLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
	    if ( mem_error ) return (mem_error);
	    lsub = Glu->lsub;
	}
	ito = nextl;
	for (ifrom = xlsub[jcol]; ifrom < nextl; )
	    lsub[ito++] = lsub[ifrom++];	
        for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;
	nextl = ito;
    }

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xprune[kcol]   = nextl;
    xlsub[kcol+1]  = nextl;

    return 0;
}